

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O2

_Bool arena_decay_impl(tsdn_t *tsdn,arena_t *arena,decay_t *decay,pac_decay_stats_t *decay_stats,
                      ecache_t *ecache,_Bool is_background_thread,_Bool all)

{
  _Bool _Var1;
  pac_purge_eagerness_t eagerness;
  
  if (all) {
    malloc_mutex_lock(tsdn,&decay->mtx);
    duckdb_je_pac_decay_all(tsdn,&(arena->pa_shard).pac,decay,decay_stats,ecache,true);
    (decay->mtx).field_0.field_0.locked.repr = false;
    pthread_mutex_unlock((pthread_mutex_t *)((long)&(decay->mtx).field_0 + 0x48));
  }
  else {
    _Var1 = malloc_mutex_trylock(tsdn,&decay->mtx);
    if (_Var1) {
      return true;
    }
    eagerness = PAC_PURGE_ALWAYS;
    if (!is_background_thread) {
      eagerness = PAC_PURGE_ON_EPOCH_ADVANCE - (duckdb_je_background_thread_enabled_state.repr & 1);
    }
    _Var1 = duckdb_je_pac_maybe_decay_purge
                      (tsdn,&(arena->pa_shard).pac,decay,decay_stats,ecache,eagerness);
    if (_Var1) {
      ecache = (ecache_t *)decay->backlog[199];
    }
    (decay->mtx).field_0.field_0.locked.repr = false;
    pthread_mutex_unlock((pthread_mutex_t *)((long)&(decay->mtx).field_0 + 0x48));
    if ((_Var1 & duckdb_je_background_thread_enabled_state.repr) == 1 && !is_background_thread) {
      arena_maybe_do_deferred_work(tsdn,arena,decay,(size_t)ecache);
    }
  }
  return false;
}

Assistant:

static bool
arena_decay_impl(tsdn_t *tsdn, arena_t *arena, decay_t *decay,
    pac_decay_stats_t *decay_stats, ecache_t *ecache,
    bool is_background_thread, bool all) {
	if (all) {
		malloc_mutex_lock(tsdn, &decay->mtx);
		pac_decay_all(tsdn, &arena->pa_shard.pac, decay, decay_stats,
		    ecache, /* fully_decay */ all);
		malloc_mutex_unlock(tsdn, &decay->mtx);
		return false;
	}

	if (malloc_mutex_trylock(tsdn, &decay->mtx)) {
		/* No need to wait if another thread is in progress. */
		return true;
	}
	pac_purge_eagerness_t eagerness =
	    arena_decide_unforced_purge_eagerness(is_background_thread);
	bool epoch_advanced = pac_maybe_decay_purge(tsdn, &arena->pa_shard.pac,
	    decay, decay_stats, ecache, eagerness);
	size_t npages_new;
	if (epoch_advanced) {
		/* Backlog is updated on epoch advance. */
		npages_new = decay_epoch_npages_delta(decay);
	}
	malloc_mutex_unlock(tsdn, &decay->mtx);

	if (have_background_thread && background_thread_enabled() &&
	    epoch_advanced && !is_background_thread) {
		arena_maybe_do_deferred_work(tsdn, arena, decay, npages_new);
	}

	return false;
}